

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O0

size_t __thiscall jrtplib::RTCPSDESPacket::GetPRIVPrefixLength(RTCPSDESPacket *this)

{
  uint8_t *puVar1;
  size_t prefixlength;
  uint8_t *preflen;
  RTCPSDESHeader *sdeshdr;
  RTCPSDESPacket *this_local;
  
  if (((this->super_RTCPPacket).knownformat & 1U) == 0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else if (this->currentchunk == (uint8_t *)0x0) {
    this_local = (RTCPSDESPacket *)0x0;
  }
  else {
    puVar1 = this->currentchunk + this->itemoffset;
    if (*puVar1 == '\b') {
      if (puVar1[1] == '\0') {
        this_local = (RTCPSDESPacket *)0x0;
      }
      else {
        this_local = (RTCPSDESPacket *)(ulong)this->currentchunk[this->itemoffset + 2];
        if ((RTCPSDESPacket *)(long)(int)(puVar1[1] - 1) < this_local) {
          this_local = (RTCPSDESPacket *)0x0;
        }
      }
    }
    else {
      this_local = (RTCPSDESPacket *)0x0;
    }
  }
  return (size_t)this_local;
}

Assistant:

inline size_t RTCPSDESPacket::GetPRIVPrefixLength() const
{
	if (!knownformat)
		return 0;
	if (currentchunk == 0)
		return 0;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	if (sdeshdr->sdesid != RTCP_SDES_ID_PRIVATE)
		return 0;
	if (sdeshdr->length == 0)
		return 0;
	uint8_t *preflen = currentchunk+itemoffset+sizeof(RTCPSDESHeader);
	size_t prefixlength = (size_t)(*preflen);
	if (prefixlength > (size_t)((sdeshdr->length)-1))
		return 0;
	return prefixlength;
}